

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::FeatureDescription::ByteSizeLong(FeatureDescription *this)

{
  size_type sVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  
  sVar1 = ((this->name_).ptr_)->_M_string_length;
  if (sVar1 == 0) {
    sVar5 = 0;
  }
  else {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar1 = ((this->shortdescription_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->type_ != (FeatureType *)0x0 &&
      this != (FeatureDescription *)&_FeatureDescription_default_instance_) {
    sVar3 = FeatureType::ByteSizeLong(this->type_);
    uVar4 = (uint)sVar3 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t FeatureDescription::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FeatureDescription)
  size_t total_size = 0;

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->name());
  }

  // string shortDescription = 2;
  if (this->shortdescription().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->shortdescription());
  }

  // .CoreML.Specification.FeatureType type = 3;
  if (this->has_type()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->type_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}